

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

ZSTD_DDict * ZSTD_getDDict(ZSTD_DCtx *dctx)

{
  ZSTD_dictUses_e ZVar1;
  
  ZVar1 = dctx->dictUses;
  if (ZVar1 != ZSTD_use_indefinitely) {
    if (ZVar1 == ZSTD_dont_use) {
      ZSTD_clearDict(dctx);
      return (ZSTD_DDict *)0x0;
    }
    if (ZVar1 != ZSTD_use_once) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x487,"const ZSTD_DDict *ZSTD_getDDict(ZSTD_DCtx *)");
    }
    dctx->dictUses = ZSTD_dont_use;
  }
  return dctx->ddict;
}

Assistant:

static ZSTD_DDict const* ZSTD_getDDict(ZSTD_DCtx* dctx)
{
    switch (dctx->dictUses) {
    default:
        assert(0 /* Impossible */);
        ZSTD_FALLTHROUGH;
    case ZSTD_dont_use:
        ZSTD_clearDict(dctx);
        return NULL;
    case ZSTD_use_indefinitely:
        return dctx->ddict;
    case ZSTD_use_once:
        dctx->dictUses = ZSTD_dont_use;
        return dctx->ddict;
    }
}